

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O1

void anon_unknown.dwarf_3983::test_remove(void **param_1)

{
  _Bool _Var1;
  roaring64_bitmap_t *r;
  uint64_t uVar2;
  
  uVar2 = 0;
  r = roaring64_bitmap_create();
  do {
    roaring64_bitmap_add(r,uVar2);
    uVar2 = uVar2 + 10000;
  } while (uVar2 != 1000000);
  uVar2 = 0;
  do {
    _Var1 = roaring64_bitmap_contains(r,uVar2);
    _assert_true((ulong)_Var1,"roaring64_bitmap_contains(r, i * 10000)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
                 ,0x1f1);
    uVar2 = uVar2 + 10000;
  } while (uVar2 != 1000000);
  uVar2 = 0;
  do {
    roaring64_bitmap_remove(r,uVar2);
    assert_r64_valid((roaring64_bitmap_t *)r);
    uVar2 = uVar2 + 10000;
  } while (uVar2 != 1000000);
  uVar2 = 0;
  do {
    _Var1 = roaring64_bitmap_contains(r,uVar2);
    _assert_true((ulong)!_Var1,"roaring64_bitmap_contains(r, i * 10000)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
                 ,0x1f8);
    uVar2 = uVar2 + 10000;
  } while (uVar2 != 1000000);
  roaring64_bitmap_free(r);
  return;
}

Assistant:

DEFINE_TEST(test_remove) {
    roaring64_bitmap_t* r = roaring64_bitmap_create();
    for (uint64_t i = 0; i < 100; ++i) {
        roaring64_bitmap_add(r, i * 10000);
    }
    for (uint64_t i = 0; i < 100; ++i) {
        assert_true(roaring64_bitmap_contains(r, i * 10000));
    }
    for (uint64_t i = 0; i < 100; ++i) {
        roaring64_bitmap_remove(r, i * 10000);
        assert_r64_valid(r);
    }
    for (uint64_t i = 0; i < 100; ++i) {
        assert_false(roaring64_bitmap_contains(r, i * 10000));
    }
    roaring64_bitmap_free(r);
}